

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O3

__pid_t __thiscall embree::LinearBarrierActive::wait(LinearBarrierActive *this,void *__stat_loc)

{
  size_t i;
  uchar *puVar1;
  ulong uVar2;
  size_t i_1;
  long lVar3;
  
  if (this->mode == 0) {
    if (__stat_loc == (void *)0x0) {
      if (this->threadCount != 0) {
        uVar2 = 0;
        do {
          this->count1[uVar2] = '\0';
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->threadCount);
      }
      if (1 < this->threadCount) {
        puVar1 = this->count0;
        uVar2 = 1;
        do {
          if (puVar1[uVar2] == '\0') {
            lVar3 = 0;
            do {
              do {
                lVar3 = lVar3 + 1;
              } while (lVar3 != 8);
              puVar1 = this->count0;
              lVar3 = 0;
            } while (puVar1[uVar2] == '\0');
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->threadCount);
      }
      this->mode = 1;
      this->flag1 = 0;
      this->flag0 = 1;
      return 1;
    }
    puVar1 = this->count0;
    puVar1[(long)__stat_loc] = '\x01';
    if (this->flag0 == 0) {
      puVar1 = (uchar *)0x0;
      do {
        do {
          puVar1 = puVar1 + 1;
        } while (puVar1 != (uchar *)0x8);
        puVar1 = (uchar *)0x0;
      } while (this->flag0 == 0);
    }
  }
  else {
    if (__stat_loc == (void *)0x0) {
      if (this->threadCount != 0) {
        uVar2 = 0;
        do {
          this->count0[uVar2] = '\0';
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->threadCount);
      }
      if (1 < this->threadCount) {
        puVar1 = this->count1;
        uVar2 = 1;
        do {
          if (puVar1[uVar2] == '\0') {
            lVar3 = 0;
            do {
              do {
                lVar3 = lVar3 + 1;
              } while (lVar3 != 8);
              puVar1 = this->count1;
              lVar3 = 0;
            } while (puVar1[uVar2] == '\0');
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->threadCount);
      }
      this->mode = 0;
      this->flag0 = 0;
      this->flag1 = 1;
      return 0;
    }
    puVar1 = this->count1;
    puVar1[(long)__stat_loc] = '\x01';
    if (this->flag1 == 0) {
      puVar1 = (uchar *)0x0;
      do {
        do {
          puVar1 = puVar1 + 1;
        } while (puVar1 != (uchar *)0x8);
        puVar1 = (uchar *)0x0;
      } while (this->flag1 == 0);
    }
  }
  return (__pid_t)puVar1;
}

Assistant:

void LinearBarrierActive::wait (const size_t threadIndex)
  {
    if (mode == 0)
    {			
      if (threadIndex == 0)
      {	
        for (size_t i=0; i<threadCount; i++)
          count1[i] = 0;
        
        for (size_t i=1; i<threadCount; i++)
        {
          while (likely(count0[i] == 0)) 
            pause_cpu();
        }
        mode  = 1;
        flag1 = 0;
        __memory_barrier();
        flag0 = 1;
      }			
      else
      {					
        count0[threadIndex] = 1;
        {
          while (likely(flag0 == 0))
            pause_cpu();
        }
        
      }		
    }					
    else						
    {
      if (threadIndex == 0)
      {	
        for (size_t i=0; i<threadCount; i++)
          count0[i] = 0;
        
        for (size_t i=1; i<threadCount; i++)
        {		
          while (likely(count1[i] == 0))
            pause_cpu();
        }
        
        mode  = 0;
        flag0 = 0;
        __memory_barrier();
        flag1 = 1;
      }			
      else
      {					
        count1[threadIndex] = 1;
        {
          while (likely(flag1 == 0))
            pause_cpu();
        }
      }		
    }					
  }